

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

bool pybind11::detail::apply_exception_translators
               (forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
                *translators)

{
  _func_void_exception_ptr *p_Var1;
  undefined8 in_RDI;
  _func_void_exception_ptr **translator;
  iterator __end2;
  iterator __begin2;
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  *__range2;
  exception_ptr last_exception;
  exception_ptr *in_stack_ffffffffffffff88;
  exception_ptr *in_stack_ffffffffffffff90;
  undefined1 local_40 [8];
  reference local_38;
  _Self local_30;
  _Self local_28;
  undefined8 local_20;
  undefined8 local_10;
  byte local_1;
  
  local_10 = in_RDI;
  std::current_exception();
  local_20 = local_10;
  local_28._M_node =
       (_Fwd_list_node_base *)
       std::
       forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
       ::begin((forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
                *)in_stack_ffffffffffffff88);
  local_30._M_node =
       (_Fwd_list_node_base *)
       std::
       forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
       ::end((forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
              *)in_stack_ffffffffffffff88);
  local_1 = std::operator!=(&local_28,&local_30);
  if ((bool)local_1) {
    local_38 = std::_Fwd_list_iterator<void_(*)(std::__exception_ptr::exception_ptr)>::operator*
                         ((_Fwd_list_iterator<void_(*)(std::__exception_ptr::exception_ptr)> *)
                          0x2b787d);
    p_Var1 = *local_38;
    std::__exception_ptr::exception_ptr::exception_ptr
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    (*p_Var1)((exception_ptr)local_40);
    std::__exception_ptr::exception_ptr::~exception_ptr(in_stack_ffffffffffffff90);
  }
  std::__exception_ptr::exception_ptr::~exception_ptr(in_stack_ffffffffffffff90);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool apply_exception_translators(std::forward_list<ExceptionTranslator> &translators) {
    auto last_exception = std::current_exception();

    for (auto &translator : translators) {
        try {
            translator(last_exception);
            return true;
        } catch (...) {
            last_exception = std::current_exception();
        }
    }
    return false;
}